

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::CloneTopOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  State *__dest;
  size_t sVar6;
  Frag *pFVar7;
  size_t __n;
  uint uVar8;
  undefined8 local_48;
  
  pcVar5 = operandStack->stackTop_;
  if ((ulong)((long)pcVar5 - (long)operandStack->stack_) < 0xc) {
    __assert_fail("GetSize() >= sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x92,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Frag]"
                 );
  }
  uVar1 = *(undefined8 *)(pcVar5 + -0xc);
  uVar2 = *(uint *)(pcVar5 + -4);
  uVar3 = this->stateCount_;
  uVar8 = uVar3 - uVar2;
  __dest = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                     (&this->states_,(ulong)uVar8);
  if (uVar2 < this->stateCount_) {
    __n = (ulong)uVar8 << 4;
    memcpy(__dest,(this->states_).stack_ + (ulong)uVar2 * 0x10,__n);
    if (uVar3 != uVar2) {
      sVar6 = 0;
      do {
        iVar4 = *(int *)((long)&__dest->out + sVar6);
        if (iVar4 != -1) {
          *(uint *)((long)&__dest->out + sVar6) = iVar4 + uVar8;
        }
        iVar4 = *(int *)((long)&__dest->out1 + sVar6);
        if (iVar4 != -1) {
          *(uint *)((long)&__dest->out1 + sVar6) = iVar4 + uVar8;
        }
        sVar6 = sVar6 + 0x10;
      } while (__n != sVar6);
    }
    local_48._0_4_ = (int)uVar1;
    local_48._4_4_ = (int)((ulong)uVar1 >> 0x20);
    pFVar7 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                       (operandStack,1);
    pFVar7->start = uVar8 + (int)local_48;
    pFVar7->out = uVar8 + local_48._4_4_;
    pFVar7->minIndex = uVar3;
    this->stateCount_ = this->stateCount_ + uVar8;
    return;
  }
  __assert_fail("index < stateCount_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                ,0xaa,
                "State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

Range& GetRange(SizeType index) {
        RAPIDJSON_ASSERT(index < rangeCount_);
        return ranges_.template Bottom<Range>()[index];
    }